

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

char * Prs_ObjGetName(Prs_Ntk_t *p,int NameId)

{
  char cVar1;
  char *pcVar2;
  Vec_Str_t *p_00;
  byte *pbVar3;
  byte bVar4;
  
  pcVar2 = Abc_NamStr(p->pStrs,NameId);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    cVar1 = *pcVar2;
    if (cVar1 != '\\') {
      if (cVar1 == '\0') {
        __assert_fail("pName != NULL && *pName != \'\\0\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaWriteVer.c"
                      ,0x8b,"int Prs_NameIsLegalInVerilog(char *, int)");
      }
      if ((NameId < 0xd) ||
         (((byte)(cVar1 + 0x85U) < 0xe6 && (cVar1 != '_' && 0x19 < (byte)(cVar1 + 0xbfU))))) {
LAB_003ed097:
        p_00 = Abc_NamBuffer(p->pStrs);
        pcVar2 = Vec_StrPrintF(p_00,"\\%s ",pcVar2);
        return pcVar2;
      }
      bVar4 = pcVar2[1];
      if (bVar4 != 0) {
        pbVar3 = (byte *)(pcVar2 + 2);
        do {
          if (((((byte)(bVar4 - 0x3a) < 0xf6) && ((byte)((bVar4 & 0xdf) + 0xa5) < 0xe6)) &&
              (bVar4 != 0x5f)) && (bVar4 != 0x24)) goto LAB_003ed097;
          bVar4 = *pbVar3;
          pbVar3 = pbVar3 + 1;
        } while (bVar4 != 0);
      }
    }
  }
  return pcVar2;
}

Assistant:

char * Prs_ObjGetName( Prs_Ntk_t * p, int NameId )
{
    char * pName = Prs_NtkStr(p, NameId);
    if ( pName == NULL )
        return pName;
    if ( Prs_NameIsLegalInVerilog(pName, NameId) )
        return pName;
    return Vec_StrPrintF( Abc_NamBuffer(p->pStrs), "\\%s ", pName );
}